

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O0

void __thiscall HEkkDualRHS::updatePivots(HEkkDualRHS *this,HighsInt iRow,double value)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  double primal_infeasibility;
  double upper;
  double lower;
  double Tp;
  double local_38;
  
  dVar1 = *(double *)(*(long *)(*in_RDI + 8) + 0x118);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x2668),(long)in_ESI);
  *pvVar3 = in_XMM0_Qa;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x2638),(long)in_ESI);
  dVar2 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x2650),(long)in_ESI);
  local_38 = 0.0;
  if (dVar2 - dVar1 <= in_XMM0_Qa) {
    if (*pvVar3 + dVar1 < in_XMM0_Qa) {
      local_38 = in_XMM0_Qa - *pvVar3;
    }
  }
  else {
    local_38 = dVar2 - in_XMM0_Qa;
  }
  if ((*(byte *)(*in_RDI + 0x28c9) & 1) == 0) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)in_ESI);
    *pvVar3 = ABS(local_38);
  }
  else {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)in_ESI);
    *pvVar3 = local_38 * local_38;
  }
  return;
}

Assistant:

void HEkkDualRHS::updatePivots(const HighsInt iRow, const double value) {
  // Update the primal value for the row (iRow) where the basis change
  // has occurred, and set the corresponding primal infeasibility
  // value in work_infeasibility
  //
  const double Tp = ekk_instance_.options_->primal_feasibility_tolerance;
  ekk_instance_.info_.baseValue_[iRow] = value;
  // @primal_infeasibility calculation
  const double lower = ekk_instance_.info_.baseLower_[iRow];
  const double upper = ekk_instance_.info_.baseUpper_[iRow];
  double primal_infeasibility = 0;
  if (value < lower - Tp) {
    primal_infeasibility = lower - value;
  } else if (value > upper + Tp) {
    primal_infeasibility = value - upper;
  }
  if (ekk_instance_.info_.store_squared_primal_infeasibility)
    work_infeasibility[iRow] = primal_infeasibility * primal_infeasibility;
  else
    work_infeasibility[iRow] = fabs(primal_infeasibility);
}